

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O3

int32_t __thiscall
icu_63::TZGNCore::findBestMatch
          (TZGNCore *this,UnicodeString *text,int32_t start,uint32_t types,UnicodeString *tzID,
          UTimeZoneFormatTimeType *timeType,UErrorCode *status)

{
  short sVar1;
  bool bVar2;
  UBool UVar3;
  uint uVar4;
  int iVar5;
  int32_t iVar6;
  UTimeZoneNameType UVar7;
  undefined4 extraout_var;
  UMemory *this_01;
  void *pvVar8;
  uint uVar9;
  UVector *this_02;
  int32_t i;
  int iVar10;
  int32_t iVar11;
  UnicodeString bestMatchTzID;
  UnicodeString mzID;
  UTimeZoneFormatTimeType local_e0;
  UnicodeString local_b0;
  UnicodeString local_70;
  MatchInfoCollection *this_00;
  
  *timeType = UTZFMT_TIME_TYPE_UNKNOWN;
  UnicodeString::setToBogus(tzID);
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  if (types == 0) {
LAB_002017d5:
    local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
    local_b0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e4fd8;
    local_e0 = UTZFMT_TIME_TYPE_UNKNOWN;
    iVar5 = 0;
  }
  else {
    uVar4 = (int)(types << 0x1e) >> 0x1f & 3;
    uVar9 = uVar4 + 0x18;
    if ((types & 4) == 0) {
      uVar9 = uVar4;
    }
    iVar5 = (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[0xf])
                      (this->fTimeZoneNames,text,(ulong)(uint)start,(ulong)uVar9,status);
    this_00 = (MatchInfoCollection *)CONCAT44(extraout_var,iVar5);
    if (U_ZERO_ERROR < *status) {
      return 0;
    }
    local_b0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e4fd8;
    local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
    if (this_00 == (MatchInfoCollection *)0x0) goto LAB_002017d5;
    local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e4fd8;
    local_70.fUnion.fStackFields.fLengthAndFlags = 2;
    bVar2 = false;
    local_e0 = UTZFMT_TIME_TYPE_UNKNOWN;
    iVar11 = 0;
    for (iVar10 = 0; iVar6 = TimeZoneNames::MatchInfoCollection::size(this_00), iVar5 = iVar11,
        iVar10 < iVar6; iVar10 = iVar10 + 1) {
      iVar5 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt(this_00,iVar10);
      if (iVar11 < iVar5) {
        UVar3 = TimeZoneNames::MatchInfoCollection::getTimeZoneIDAt(this_00,iVar10,&local_b0);
        if ((UVar3 == '\0') &&
           (UVar3 = TimeZoneNames::MatchInfoCollection::getMetaZoneIDAt(this_00,iVar10,&local_70),
           UVar3 != '\0')) {
          (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[8])
                    (this->fTimeZoneNames,&local_70,this->fTargetRegion,&local_b0);
        }
        UVar7 = TimeZoneNames::MatchInfoCollection::getNameTypeAt(this_00,iVar10);
        if (U_ZERO_ERROR < *status) break;
        iVar11 = iVar5;
        if ((int)UVar7 < 0x10) {
          if (UVar7 == UTZNM_LONG_STANDARD) {
LAB_002017a5:
            local_e0 = UTZFMT_TIME_TYPE_STANDARD;
            bVar2 = true;
          }
          else {
            if (UVar7 == UTZNM_LONG_DAYLIGHT) goto LAB_0020179b;
LAB_00201782:
            local_e0 = UTZFMT_TIME_TYPE_UNKNOWN;
          }
        }
        else {
          if (UVar7 == UTZNM_SHORT_STANDARD) goto LAB_002017a5;
          if (UVar7 != UTZNM_SHORT_DAYLIGHT) goto LAB_00201782;
LAB_0020179b:
          local_e0 = UTZFMT_TIME_TYPE_DAYLIGHT;
        }
      }
    }
    (*this_00->_vptr_MatchInfoCollection[1])(this_00);
    iVar11 = 0;
    if (U_ZERO_ERROR < *status) {
LAB_0020194c:
      UnicodeString::~UnicodeString(&local_70);
      goto LAB_00201958;
    }
    sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar10 = (text->fUnion).fFields.fLength;
    }
    else {
      iVar10 = (int)sVar1 >> 5;
    }
    if (!bVar2 && iVar5 == iVar10 - start) {
      UnicodeString::copyFrom(tzID,&local_b0,'\0');
      *timeType = local_e0;
      iVar11 = iVar5;
      goto LAB_0020194c;
    }
    UnicodeString::~UnicodeString(&local_70);
  }
  this_01 = (UMemory *)findLocal(this,text,start,types,status);
  iVar11 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this_01 != (UMemory *)0x0) {
      this_02 = *(UVector **)this_01;
      if (this_02 != (UVector *)0x0) {
        uVar9 = 0;
        do {
          if (this_02->count <= (int)uVar9) {
            (*(this_02->super_UObject)._vptr_UObject[1])();
            break;
          }
          text = (UnicodeString *)(ulong)uVar9;
          pvVar8 = UVector::elementAt(this_02,uVar9);
          if (pvVar8 == (void *)0x0) {
            iVar10 = -1;
          }
          else {
            iVar10 = *(int *)((long)pvVar8 + 8);
          }
          if (iVar5 <= iVar10) {
            pvVar8 = UVector::elementAt(*(UVector **)this_01,uVar9);
            if (pvVar8 == (void *)0x0) {
              iVar5 = -1;
            }
            else {
              iVar5 = *(int *)((long)pvVar8 + 8);
            }
            local_e0 = UTZFMT_TIME_TYPE_UNKNOWN;
            text = (UnicodeString *)(ulong)uVar9;
            TimeZoneGenericNameMatchInfo::getTimeZoneID
                      ((TimeZoneGenericNameMatchInfo *)this_01,uVar9,&local_b0);
          }
          uVar9 = uVar9 + 1;
          this_02 = *(UVector **)this_01;
        } while (this_02 != (UVector *)0x0);
      }
      UMemory::operator_delete(this_01,text);
    }
    iVar11 = iVar5;
    if (0 < iVar5) {
      *timeType = local_e0;
      UnicodeString::copyFrom(tzID,&local_b0,'\0');
    }
  }
LAB_00201958:
  UnicodeString::~UnicodeString(&local_b0);
  return iVar11;
}

Assistant:

int32_t
TZGNCore::findBestMatch(const UnicodeString& text, int32_t start, uint32_t types,
        UnicodeString& tzID, UTimeZoneFormatTimeType& timeType, UErrorCode& status) const {
    timeType = UTZFMT_TIME_TYPE_UNKNOWN;
    tzID.setToBogus();

    if (U_FAILURE(status)) {
        return 0;
    }

    // Find matches in the TimeZoneNames first
    TimeZoneNames::MatchInfoCollection *tznamesMatches = findTimeZoneNames(text, start, types, status);
    if (U_FAILURE(status)) {
        return 0;
    }

    int32_t bestMatchLen = 0;
    UTimeZoneFormatTimeType bestMatchTimeType = UTZFMT_TIME_TYPE_UNKNOWN;
    UnicodeString bestMatchTzID;
    // UBool isLongStandard = FALSE;   // workaround - see the comments below
    UBool isStandard = FALSE;       // TODO: Temporary hack (on hack) for short standard name/location name conflict (found in zh_Hant), should be removed after CLDR 21m1 integration

    if (tznamesMatches != NULL) {
        UnicodeString mzID;
        for (int32_t i = 0; i < tznamesMatches->size(); i++) {
            int32_t len = tznamesMatches->getMatchLengthAt(i);
            if (len > bestMatchLen) {
                bestMatchLen = len;
                if (!tznamesMatches->getTimeZoneIDAt(i, bestMatchTzID)) {
                    // name for a meta zone
                    if (tznamesMatches->getMetaZoneIDAt(i, mzID)) {
                        fTimeZoneNames->getReferenceZoneID(mzID, fTargetRegion, bestMatchTzID);
                    }
                }
                UTimeZoneNameType nameType = tznamesMatches->getNameTypeAt(i);
                if (U_FAILURE(status)) {
                    break;
                }
                switch (nameType) {
                case UTZNM_LONG_STANDARD:
                    // isLongStandard = TRUE;
                case UTZNM_SHORT_STANDARD:  // this one is never used for generic, but just in case
                    isStandard = TRUE;      // TODO: Remove this later, see the comments above.
                    bestMatchTimeType = UTZFMT_TIME_TYPE_STANDARD;
                    break;
                case UTZNM_LONG_DAYLIGHT:
                case UTZNM_SHORT_DAYLIGHT: // this one is never used for generic, but just in case
                    bestMatchTimeType = UTZFMT_TIME_TYPE_DAYLIGHT;
                    break;
                default:
                    bestMatchTimeType = UTZFMT_TIME_TYPE_UNKNOWN;
                }
            }
        }
        delete tznamesMatches;
        if (U_FAILURE(status)) {
            return 0;
        }

        if (bestMatchLen == (text.length() - start)) {
            // Full match

            //tzID.setTo(bestMatchTzID);
            //timeType = bestMatchTimeType;
            //return bestMatchLen;

            // TODO Some time zone uses a same name for the long standard name
            // and the location name. When the match is a long standard name,
            // then we need to check if the name is same with the location name.
            // This is probably a data error or a design bug.
/*
            if (!isLongStandard) {
                tzID.setTo(bestMatchTzID);
                timeType = bestMatchTimeType;
                return bestMatchLen;
            }
*/
            // TODO The deprecation of commonlyUsed flag introduced the name
            // conflict not only for long standard names, but short standard names too.
            // These short names (found in zh_Hant) should be gone once we clean
            // up CLDR time zone display name data. Once the short name conflict
            // problem (with location name) is resolved, we should change the condition
            // below back to the original one above. -Yoshito (2011-09-14)
            if (!isStandard) {
                tzID.setTo(bestMatchTzID);
                timeType = bestMatchTimeType;
                return bestMatchLen;
            }
        }
    }

    // Find matches in the local trie
    TimeZoneGenericNameMatchInfo *localMatches = findLocal(text, start, types, status);
    if (U_FAILURE(status)) {
        return 0;
    }
    if (localMatches != NULL) {
        for (int32_t i = 0; i < localMatches->size(); i++) {
            int32_t len = localMatches->getMatchLength(i);

            // TODO See the above TODO. We use len >= bestMatchLen
            // because of the long standard/location name collision
            // problem. If it is also a location name, carrying
            // timeType = UTZFMT_TIME_TYPE_STANDARD will cause a
            // problem in SimpleDateFormat
            if (len >= bestMatchLen) {
                bestMatchLen = localMatches->getMatchLength(i);
                bestMatchTimeType = UTZFMT_TIME_TYPE_UNKNOWN;   // because generic
                localMatches->getTimeZoneID(i, bestMatchTzID);
            }
        }
        delete localMatches;
    }

    if (bestMatchLen > 0) {
        timeType = bestMatchTimeType;
        tzID.setTo(bestMatchTzID);
    }
    return bestMatchLen;
}